

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var Js::JavascriptString::CallRegExFunction<1>
              (RecyclableObject *fnObj,Var regExp,Arguments *args,ScriptContext *scriptContext)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  bool bVar2;
  Attributes attributes;
  JavascriptMethod p_Var3;
  Var pvVar4;
  RecyclableObject *ptr;
  Arguments local_48;
  bool local_31;
  
  this = scriptContext->threadContext;
  local_48.Info = args->Info;
  local_48.Values = args->Values;
  local_31 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes(fnObj);
  bVar2 = ThreadContext::HasNoSideEffect(this,fnObj,attributes);
  if (bVar2) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (this->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var3 = RecyclableObject::GetEntryPoint(fnObj);
    CheckIsExecutable(fnObj,p_Var3);
    p_Var3 = RecyclableObject::GetEntryPoint(fnObj);
    pvVar4 = Arguments::operator[](&local_48,0);
    ptr = (RecyclableObject *)
          (*p_Var3)(fnObj,(CallInfo)fnObj,0x2000002,0,0,0,0,0x2000002,regExp,pvVar4);
    bVar2 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((fnObj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
            super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_00d25d20;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this->implicitCallFlags;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
      if (this->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var3 = RecyclableObject::GetEntryPoint(fnObj);
      CheckIsExecutable(fnObj,p_Var3);
      p_Var3 = RecyclableObject::GetEntryPoint(fnObj);
      pvVar4 = Arguments::operator[](&local_48,0);
      ptr = (RecyclableObject *)
            (*p_Var3)(fnObj,(CallInfo)fnObj,0x2000002,0,0,0,0,0x2000002,regExp,pvVar4);
      this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00d25d20;
    }
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (this->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var3 = RecyclableObject::GetEntryPoint(fnObj);
    CheckIsExecutable(fnObj,p_Var3);
    p_Var3 = RecyclableObject::GetEntryPoint(fnObj);
    pvVar4 = Arguments::operator[](&local_48,0);
    ptr = (RecyclableObject *)
          (*p_Var3)(fnObj,(CallInfo)fnObj,0x2000002,0,0,0,0,0x2000002,regExp,pvVar4);
    bVar2 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar2 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00d25d20:
  this->reentrancySafeOrHandled = local_31;
  return ptr;
}

Assistant:

Var JavascriptString::CallRegExFunction<1>(RecyclableObject* fnObj, Var regExp, Arguments& args, ScriptContext *scriptContext)
    {
        // args[0]: String
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        return threadContext->ExecuteImplicitCall(fnObj, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, fnObj, CallInfo(CallFlags_Value, 2), regExp, args[0]);
        });
    }